

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

ALCenum anon_unknown.dwarf_65b09::EnumFromDevFmt(DevFmtChannels channels)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  runtime_error *this;
  byte in_DIL;
  undefined3 in_stack_ffffffffffffffa8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffac;
  string local_28 [20];
  int in_stack_ffffffffffffffec;
  ALCenum local_4;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)in_DIL;
  switch(__rhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    local_4 = 0x1500;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    local_4 = 0x1501;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    local_4 = 0x1503;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
    local_4 = 0x1504;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    local_4 = 0x1505;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    local_4 = 0x1506;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    local_4 = 0x1507;
    break;
  default:
    uVar1 = CONCAT13(1,in_stack_ffffffffffffffa8);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffffec);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffffac,uVar1),__rhs);
    std::runtime_error::runtime_error(this,local_28);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_4;
}

Assistant:

ALCenum EnumFromDevFmt(DevFmtChannels channels)
{
    switch(channels)
    {
    case DevFmtMono: return ALC_MONO_SOFT;
    case DevFmtStereo: return ALC_STEREO_SOFT;
    case DevFmtQuad: return ALC_QUAD_SOFT;
    case DevFmtX51: /* fall-through */
    case DevFmtX51Rear: return ALC_5POINT1_SOFT;
    case DevFmtX61: return ALC_6POINT1_SOFT;
    case DevFmtX71: return ALC_7POINT1_SOFT;
    case DevFmtAmbi3D: return ALC_BFORMAT3D_SOFT;
    }
    throw std::runtime_error{"Invalid DevFmtChannels: "+std::to_string(int(channels))};
}